

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Asyncify.cpp
# Opt level: O2

void __thiscall
wasm::anon_unknown_0::AsyncifyAssertInNonInstrumented::~AsyncifyAssertInNonInstrumented
          (AsyncifyAssertInNonInstrumented *this)

{
  ~AsyncifyAssertInNonInstrumented(this);
  operator_delete(this,0x60);
  return;
}

Assistant:

bool isFunctionParallel() override { return true; }